

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inNameHex1(Tokenizer *this,char ch)

{
  char cVar1;
  char hval;
  char ch_local;
  Tokenizer *this_local;
  
  this->hex_char = ch;
  cVar1 = util::hex_decode_char(ch);
  if (cVar1 < '\x10') {
    this->char_code = (int)cVar1 << 4;
    this->state = st_name_hex2;
  }
  else {
    QTC::TC("qpdf","QPDFTokenizer bad name 1",0);
    std::__cxx11::string::operator=
              ((string *)&this->error_message,"name with stray # will not work with PDF >= 1.2");
    std::__cxx11::string::operator+=((string *)&this->val,'\0');
    this->state = st_name;
    inName(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inNameHex1(char ch)
{
    hex_char = ch;

    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code = int(hval) << 4;
        state = st_name_hex2;
    } else {
        QTC::TC("qpdf", "QPDFTokenizer bad name 1");
        error_message = "name with stray # will not work with PDF >= 1.2";
        // Use null to encode a bad # -- this is reversed in QPDF_Name::normalizeName.
        val += '\0';
        state = st_name;
        inName(ch);
    }
}